

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrEOR0x4d(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  EOR(this,argument);
  return 4;
}

Assistant:

int CPU::instrEOR0x4d() {
	EOR(absolute_addr());
	return 4;
}